

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder.cc
# Opt level: O1

bool __thiscall draco::MeshEdgebreakerDecoder::InitializeDecoder(MeshEdgebreakerDecoder *this)

{
  long lVar1;
  char cVar2;
  DecoderBuffer *pDVar3;
  MeshEdgebreakerDecoderImplInterface *pMVar4;
  int iVar5;
  MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this_00;
  
  pDVar3 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  lVar1 = pDVar3->pos_ + 1;
  if (pDVar3->data_size_ < lVar1) {
    return false;
  }
  cVar2 = pDVar3->data_[pDVar3->pos_];
  pDVar3->pos_ = lVar1;
  pMVar4 = (this->impl_)._M_t.
           super___uniq_ptr_impl<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
           .super__Head_base<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_false>._M_head_impl;
  (this->impl_)._M_t.
  super___uniq_ptr_impl<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
  .super__Head_base<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_false>._M_head_impl =
       (MeshEdgebreakerDecoderImplInterface *)0x0;
  if (pMVar4 != (MeshEdgebreakerDecoderImplInterface *)0x0) {
    (*pMVar4->_vptr_MeshEdgebreakerDecoderImplInterface[1])();
  }
  if (cVar2 == '\x02') {
    this_00 = (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *)
              operator_new(0x350);
    MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
    MeshEdgebreakerDecoderImpl(this_00);
  }
  else if (cVar2 == '\x01') {
    this_00 = (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *)
              operator_new(0x330);
    MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
    MeshEdgebreakerDecoderImpl
              ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder> *)
               this_00);
  }
  else {
    if (cVar2 != '\0') goto LAB_001285d8;
    this_00 = (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *)
              operator_new(0x2e8);
    MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::MeshEdgebreakerDecoderImpl
              ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *)this_00);
  }
  pMVar4 = (this->impl_)._M_t.
           super___uniq_ptr_impl<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
           .super__Head_base<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_false>._M_head_impl;
  (this->impl_)._M_t.
  super___uniq_ptr_impl<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
  .super__Head_base<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_false>._M_head_impl =
       &this_00->super_MeshEdgebreakerDecoderImplInterface;
  if (pMVar4 != (MeshEdgebreakerDecoderImplInterface *)0x0) {
    (*pMVar4->_vptr_MeshEdgebreakerDecoderImplInterface[1])();
  }
LAB_001285d8:
  pMVar4 = (this->impl_)._M_t.
           super___uniq_ptr_impl<draco::MeshEdgebreakerDecoderImplInterface,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerDecoderImplInterface>_>
           .super__Head_base<0UL,_draco::MeshEdgebreakerDecoderImplInterface_*,_false>._M_head_impl;
  if (pMVar4 == (MeshEdgebreakerDecoderImplInterface *)0x0) {
    return false;
  }
  iVar5 = (*pMVar4->_vptr_MeshEdgebreakerDecoderImplInterface[2])(pMVar4,this);
  return SUB41(iVar5,0);
}

Assistant:

bool MeshEdgebreakerDecoder::InitializeDecoder() {
  uint8_t traversal_decoder_type;
  if (!buffer()->Decode(&traversal_decoder_type)) {
    return false;
  }
  impl_ = nullptr;
  if (traversal_decoder_type == MESH_EDGEBREAKER_STANDARD_ENCODING) {
#ifdef DRACO_STANDARD_EDGEBREAKER_SUPPORTED
    impl_ = std::unique_ptr<MeshEdgebreakerDecoderImplInterface>(
        new MeshEdgebreakerDecoderImpl<MeshEdgebreakerTraversalDecoder>());
#endif
  } else if (traversal_decoder_type == MESH_EDGEBREAKER_PREDICTIVE_ENCODING) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
#ifdef DRACO_PREDICTIVE_EDGEBREAKER_SUPPORTED
    impl_ = std::unique_ptr<MeshEdgebreakerDecoderImplInterface>(
        new MeshEdgebreakerDecoderImpl<
            MeshEdgebreakerTraversalPredictiveDecoder>());
#endif
#endif
  } else if (traversal_decoder_type == MESH_EDGEBREAKER_VALENCE_ENCODING) {
    impl_ = std::unique_ptr<MeshEdgebreakerDecoderImplInterface>(
        new MeshEdgebreakerDecoderImpl<
            MeshEdgebreakerTraversalValenceDecoder>());
  }
  if (!impl_) {
    return false;
  }
  if (!impl_->Init(this)) {
    return false;
  }
  return true;
}